

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preferences.cpp
# Opt level: O2

IPreferences * f8n::prefs::Preferences::Unmanaged(string *name)

{
  Preferences *this;
  undefined1 local_40 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  if (name->_M_string_length == 0) {
    this = (Preferences *)operator_new(0x68);
    Preferences(this,name,ModeTransient);
  }
  else {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_40 + 0x10),"unmanaged_",name);
    ForPlugin((string *)local_40);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_40 + 8));
    std::__cxx11::string::~string((string *)(local_40 + 0x10));
    this = (Preferences *)local_40._0_8_;
  }
  return &this->super_IPreferences;
}

Assistant:

f8n::sdk::IPreferences* Preferences::Unmanaged(const std::string& name) {
    if (!name.size()) {
        return new Preferences(name, ModeTransient);
    }

    return Preferences::ForPlugin("unmanaged_" + name).get();
}